

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWO2Surface(LWOImporter *this,uint size)

{
  uint *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint8_t uVar3;
  vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_> *this_00;
  uint8_t *puVar4;
  pointer pSVar5;
  pointer pSVar6;
  _Alloc_hider __s2;
  size_type __n;
  int iVar7;
  uint *puVar8;
  uint8_t *puVar9;
  Logger *pLVar10;
  runtime_error *prVar11;
  uint uVar12;
  uint8_t *puVar13;
  uint *puVar14;
  long lVar15;
  ushort uVar16;
  ushort uVar17;
  Surface *pSVar18;
  ulong uVar19;
  uint *puVar20;
  string derived;
  SubChunkHeader head2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  Surface local_178;
  
  puVar8 = (uint *)(this->mFileBuffer + size);
  this_00 = this->mSurfaces;
  LWO::Surface::Surface(&local_178);
  std::vector<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>::
  emplace_back<Assimp::LWO::Surface>(this_00,&local_178);
  LWO::Surface::~Surface(&local_178);
  puVar4 = this->mFileBuffer;
  pSVar5 = (this->mSurfaces->
           super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar9 = puVar4;
  if (*puVar4 != '\0') {
    uVar12 = 1;
    do {
      puVar9 = puVar9 + 1;
      if (size < uVar12) {
        pLVar10 = DefaultLogger::get();
        Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
        puVar9 = this->mFileBuffer;
        break;
      }
      this->mFileBuffer = puVar9;
      uVar12 = uVar12 + 1;
    } while (*puVar9 != '\0');
  }
  paVar2 = &local_178.mName.field_2;
  local_178.mName._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,puVar4);
  std::__cxx11::string::operator=((string *)(pSVar5 + -1),(string *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.mName._M_dataplus._M_p != paVar2) {
    operator_delete(local_178.mName._M_dataplus._M_p);
  }
  uVar19 = (ulong)((int)puVar9 - (int)puVar4 & 1);
  puVar9 = this->mFileBuffer;
  lVar15 = 2 - uVar19;
  puVar4 = puVar9 + lVar15;
  this->mFileBuffer = puVar4;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  puVar13 = puVar4;
  if (puVar9[2 - uVar19] != '\0') {
    puVar13 = puVar9 + lVar15;
    uVar12 = 1;
    do {
      puVar13 = puVar13 + 1;
      if ((uint)((int)puVar8 - (int)puVar4) < uVar12) {
        pLVar10 = DefaultLogger::get();
        Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
        puVar13 = this->mFileBuffer;
        break;
      }
      this->mFileBuffer = puVar13;
      uVar12 = uVar12 + 1;
    } while (*puVar13 != '\0');
  }
  local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,puVar4,puVar13);
  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.mName._M_dataplus._M_p != &local_178.mName.field_2) {
    operator_delete(local_178.mName._M_dataplus._M_p);
  }
  __n = local_198._M_string_length;
  __s2._M_p = local_198._M_dataplus._M_p;
  this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar13 - (int)puVar4 & 1));
  if (local_198._M_string_length != 0) {
    pSVar6 = (this->mSurfaces->
             super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pSVar18 = (this->mSurfaces->
                   super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>).
                   _M_impl.super__Vector_impl_data._M_start; pSVar18 != pSVar6 + -1;
        pSVar18 = pSVar18 + 1) {
      if (((pSVar18->mName)._M_string_length == __n) &&
         (iVar7 = bcmp((pSVar18->mName)._M_dataplus._M_p,__s2._M_p,__n), iVar7 == 0)) {
        LWO::Surface::operator=(pSVar5 + -1,pSVar18);
        local_198._M_string_length = 0;
        *local_198._M_dataplus._M_p = '\0';
        goto LAB_0042196f;
      }
    }
    pLVar10 = DefaultLogger::get();
    std::operator+(&local_178.mName,"LWO2: Unable to find source surface: ",&local_198);
    Logger::warn(pLVar10,local_178.mName._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.mName._M_dataplus._M_p != &local_178.mName.field_2) {
      operator_delete(local_178.mName._M_dataplus._M_p);
    }
  }
LAB_0042196f:
  puVar14 = (uint *)((long)this->mFileBuffer + 6);
  if (puVar14 < puVar8) {
    puVar20 = (uint *)this->mFileBuffer;
    do {
      uVar12 = *puVar20;
      this->mFileBuffer = (uint8_t *)(puVar20 + 1);
      uVar16 = (ushort)puVar20[1] << 8 | (ushort)puVar20[1] >> 8;
      this->mFileBuffer = (uint8_t *)puVar14;
      puVar1 = (uint *)((ulong)uVar16 + (long)puVar14);
      if (puVar8 < puVar1) {
        prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_178,"LWO2: Invalid surface chunk length","");
        std::runtime_error::runtime_error(prVar11,(string *)&local_178);
        *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
        __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      if ((int)uVar12 < 0x4c494e45) {
        if ((int)uVar12 < 0x434c5248) {
          if (uVar12 == 0x41445452) {
            if (uVar16 < 4) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: ADTR chunk is too small","");
              std::runtime_error::runtime_error(prVar11,(string *)&local_178);
              *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar12 = *puVar14;
            this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
            pSVar5[-1].mAdditiveTransparency =
                 (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                        uVar12 << 0x18);
          }
          else if (uVar12 == 0x424c4f4b) {
            if (uVar16 < 4) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: BLOK chunk is too small","");
              std::runtime_error::runtime_error(prVar11,(string *)&local_178);
              *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar12 = *puVar14;
            this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
            uVar17 = *(ushort *)((long)puVar20 + 10);
            this->mFileBuffer = (uint8_t *)(puVar20 + 3);
            uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                     uVar12 << 0x18;
            uVar17 = uVar17 << 8 | uVar17 >> 8;
            local_178.mName._M_dataplus._M_p = (pointer)(ulong)CONCAT24(uVar17,uVar12);
            if ((int)uVar12 < 0x50524f43) {
              if ((uVar12 == 0x47524144) || (uVar12 == 0x494d4150)) {
LAB_00421ddc:
                LoadLWO2TextureBlock(this,(SubChunkHeader *)&local_178,(uint)uVar16);
              }
              else {
LAB_00421e78:
                pLVar10 = DefaultLogger::get();
                Logger::warn(pLVar10,"LWO2: Found an unsupported surface BLOK");
              }
            }
            else {
              if (uVar12 == 0x50524f43) goto LAB_00421ddc;
              if (uVar12 != 0x53484452) goto LAB_00421e78;
              LoadLWO2ShaderBlock(this,(SubChunkHeader *)(ulong)uVar17,(uint)uVar16);
            }
          }
          else if (uVar12 == 0x42554d50) {
            if (uVar16 < 4) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: BUMP chunk is too small","");
              std::runtime_error::runtime_error(prVar11,(string *)&local_178);
              *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar12 = *puVar14;
            this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
            pSVar5[-1].mBumpIntensity =
                 (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                        uVar12 << 0x18);
          }
        }
        else if ((int)uVar12 < 0x44494646) {
          if (uVar12 == 0x434c5248) {
            if (uVar16 < 4) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: CLRH chunk is too small","");
              std::runtime_error::runtime_error(prVar11,(string *)&local_178);
              *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar12 = *puVar14;
            this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
            pSVar5[-1].mColorHighlights =
                 (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                        uVar12 << 0x18);
          }
          else if (uVar12 == 0x434f4c52) {
            if (uVar16 < 0xc) {
              prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,"LWO: COLR chunk is too small","");
              std::runtime_error::runtime_error(prVar11,(string *)&local_178);
              *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
              __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar12 = *puVar14;
            this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
            pSVar5[-1].mColor.r =
                 (ai_real)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                          uVar12 << 0x18);
            uVar12 = *(uint *)this->mFileBuffer;
            this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
            pSVar5[-1].mColor.g =
                 (ai_real)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                          uVar12 << 0x18);
            uVar12 = *(uint *)this->mFileBuffer;
            this->mFileBuffer = (uint8_t *)((long)this->mFileBuffer + 4);
            pSVar5[-1].mColor.b =
                 (ai_real)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                          uVar12 << 0x18);
          }
        }
        else if (uVar12 == 0x44494646) {
          if (uVar16 < 4) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: DIFF chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar14;
          this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
          pSVar5[-1].mDiffuseValue =
               (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                      uVar12 << 0x18);
        }
        else if (uVar12 == 0x474c4f53) {
          if (uVar16 < 4) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: GLOS chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar14;
          this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
          pSVar5[-1].mGlossiness =
               (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                      uVar12 << 0x18);
        }
      }
      else if ((int)uVar12 < 0x534d414e) {
        if (uVar12 == 0x4c494e45) {
          if (uVar16 < 2) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: LINE chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar14;
          this->mFileBuffer = (uint8_t *)(puVar20 + 2);
          if (((ushort)uVar12 >> 8 & 1) != 0) {
            pSVar5[-1].mWireframe = true;
          }
        }
        else if (uVar12 == 0x52494e44) {
          if (uVar16 < 4) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: RIND chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar14;
          this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
          pSVar5[-1].mIOR =
               (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                      uVar12 << 0x18);
        }
        else if (uVar12 == 0x53494445) {
          if (uVar16 < 2) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: SIDE chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar14;
          this->mFileBuffer = (uint8_t *)(puVar20 + 2);
          pSVar5[-1].bDoubleSided = (ushort)uVar12 == 0x300;
        }
      }
      else if ((int)uVar12 < 0x5452414e) {
        if (uVar12 == 0x534d414e) {
          if (uVar16 < 4) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: SMAN chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar14;
          this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
          pSVar5[-1].mMaximumSmoothAngle =
               (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                      (uVar12 & 0x7f) << 0x18);
        }
        else if (uVar12 == 0x53504543) {
          if (uVar16 < 4) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: SPEC chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar14;
          this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
          pSVar5[-1].mSpecularValue =
               (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                      uVar12 << 0x18);
        }
      }
      else if (uVar12 == 0x5452414e) {
        if ((pSVar5[-1].mTransparency != 1e+11) || (NAN(pSVar5[-1].mTransparency))) {
          if (uVar16 < 4) {
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_178,"LWO: TRAN chunk is too small","");
            std::runtime_error::runtime_error(prVar11,(string *)&local_178);
            *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
            __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar12 = *puVar14;
          this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
          pSVar5[-1].mTransparency =
               (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                      uVar12 << 0x18);
        }
      }
      else if (uVar12 == 0x56434f4c) {
        if (uVar16 < 0xc) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_178,"LWO: VCOL chunk is too small","");
          std::runtime_error::runtime_error(prVar11,(string *)&local_178);
          *(undefined ***)prVar11 = &PTR__runtime_error_008dc448;
          __cxa_throw(prVar11,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar12 = *puVar14;
        this->mFileBuffer = (uint8_t *)((long)puVar20 + 10);
        pSVar5[-1].mDiffuseValue =
             (float)(uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                    uVar12 << 0x18) * pSVar5[-1].mDiffuseValue;
        puVar4 = this->mFileBuffer;
        uVar3 = *puVar4;
        this->mFileBuffer = puVar4 + (ulong)(uVar3 == 0xff) * 2 + 2;
        uVar12 = *(uint *)(puVar4 + (ulong)(uVar3 == 0xff) * 2 + 2);
        this->mFileBuffer = puVar4 + (ulong)(uVar3 == 0xff) * 2 + 6;
        pSVar5[-1].mVCMapType =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        puVar4 = this->mFileBuffer;
        puVar9 = puVar4;
        if (*puVar4 != '\0') {
          uVar12 = 1;
          do {
            puVar9 = puVar9 + 1;
            if ((uint)((int)puVar1 - (int)puVar4) < uVar12) {
              pLVar10 = DefaultLogger::get();
              Logger::warn(pLVar10,"LWO: Invalid file, string is is too long");
              puVar9 = this->mFileBuffer;
              break;
            }
            this->mFileBuffer = puVar9;
            uVar12 = uVar12 + 1;
          } while (*puVar9 != '\0');
        }
        local_178.mName._M_dataplus._M_p = (pointer)&local_178.mName.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,puVar4,puVar9);
        std::__cxx11::string::operator=((string *)&pSVar5[-1].mVCMap,(string *)&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.mName._M_dataplus._M_p != &local_178.mName.field_2) {
          operator_delete(local_178.mName._M_dataplus._M_p);
        }
        this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)puVar9 - (int)puVar4 & 1));
      }
      this->mFileBuffer = (uint8_t *)puVar1;
      puVar14 = (uint *)((long)puVar1 + 6);
      puVar20 = puVar1;
    } while (puVar14 < puVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2Surface(unsigned int size)
{
    LE_NCONST uint8_t* const end = mFileBuffer + size;

    mSurfaces->push_back( LWO::Surface () );
    LWO::Surface& surf = mSurfaces->back();

    GetS0(surf.mName,size);

    // check whether this surface was derived from any other surface
    std::string derived;
    GetS0(derived,(unsigned int)(end - mFileBuffer));
    if (derived.length())   {
        // yes, find this surface
        for (SurfaceList::iterator it = mSurfaces->begin(), end = mSurfaces->end()-1; it != end; ++it)  {
            if ((*it).mName == derived) {
                // we have it ...
                surf = *it;
                derived.clear();break;
            }
        }
        if (derived.size())
            ASSIMP_LOG_WARN("LWO2: Unable to find source surface: " + derived);
    }

    while (true)
    {
        if (mFileBuffer + 6 >= end)
            break;
        const IFF::SubChunkHeader head = IFF::LoadSubChunk(mFileBuffer);

        if (mFileBuffer + head.length > end)
            throw DeadlyImportError("LWO2: Invalid surface chunk length");

        uint8_t* const next = mFileBuffer+head.length;
        switch (head.type)
        {
            // diffuse color
        case AI_LWO_COLR:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,COLR,12);
                surf.mColor.r = GetF4();
                surf.mColor.g = GetF4();
                surf.mColor.b = GetF4();
                break;
            }
            // diffuse strength ... hopefully
        case AI_LWO_DIFF:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,DIFF,4);
                surf.mDiffuseValue = GetF4();
                break;
            }
            // specular strength ... hopefully
        case AI_LWO_SPEC:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SPEC,4);
                surf.mSpecularValue = GetF4();
                break;
            }
            // transparency
        case AI_LWO_TRAN:
            {
                // transparency explicitly disabled?
                if (surf.mTransparency == 10e10f)
                    break;

                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,TRAN,4);
                surf.mTransparency = GetF4();
                break;
            }
            // additive transparency
        case AI_LWO_ADTR:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,ADTR,4);
                surf.mAdditiveTransparency = GetF4();
                break;
            }
            // wireframe mode
        case AI_LWO_LINE:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,LINE,2);
                if (GetU2() & 0x1)
                    surf.mWireframe = true;
                break;
            }
            // glossiness
        case AI_LWO_GLOS:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,GLOS,4);
                surf.mGlossiness = GetF4();
                break;
            }
            // bump intensity
        case AI_LWO_BUMP:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,BUMP,4);
                surf.mBumpIntensity = GetF4();
                break;
            }
            // color highlights
        case AI_LWO_CLRH:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,CLRH,4);
                surf.mColorHighlights = GetF4();
                break;
            }
            // index of refraction
        case AI_LWO_RIND:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,RIND,4);
                surf.mIOR = GetF4();
                break;
            }
            // polygon sidedness
        case AI_LWO_SIDE:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SIDE,2);
                surf.bDoubleSided = (3 == GetU2());
                break;
            }
            // maximum smoothing angle
        case AI_LWO_SMAN:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,SMAN,4);
                surf.mMaximumSmoothAngle = std::fabs( GetF4() );
                break;
            }
            // vertex color channel to be applied to the surface
        case AI_LWO_VCOL:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,VCOL,12);
                surf.mDiffuseValue *= GetF4();              // strength
                ReadVSizedIntLWO2(mFileBuffer);             // skip envelope
                surf.mVCMapType = GetU4();                  // type of the channel

                // name of the channel
                GetS0(surf.mVCMap, (unsigned int) (next - mFileBuffer ));
                break;
            }
            // surface bock entry
        case AI_LWO_BLOK:
            {
                AI_LWO_VALIDATE_CHUNK_LENGTH(head.length,BLOK,4);
                IFF::SubChunkHeader head2 = IFF::LoadSubChunk(mFileBuffer);

                switch (head2.type)
                {
                case AI_LWO_PROC:
                case AI_LWO_GRAD:
                case AI_LWO_IMAP:
                    LoadLWO2TextureBlock(&head2, head.length);
                    break;
                case AI_LWO_SHDR:
                    LoadLWO2ShaderBlock(&head2, head.length);
                    break;

                default:
                    ASSIMP_LOG_WARN("LWO2: Found an unsupported surface BLOK");
                };

                break;
            }
        }
        mFileBuffer = next;
    }
}